

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void fl_open_display(void)

{
  _func_void_char_ptr_varargs *p_Var1;
  Display *d;
  undefined8 uVar2;
  
  if (fl_display == (Display *)0x0) {
    setlocale(0,"");
    XSetLocaleModifiers("@im=");
    XSetIOErrorHandler(io_error_handler);
    XSetErrorHandler(xerror_handler);
    d = (Display *)XOpenDisplay(0);
    p_Var1 = Fl::fatal;
    if (d == (Display *)0x0) {
      uVar2 = XDisplayName(0);
      (*p_Var1)("Can\'t open display: %s",uVar2);
      d = (Display *)0x0;
    }
    fl_open_display(d);
    return;
  }
  return;
}

Assistant:

void fl_open_display() {
  if (fl_display) return;

  setlocale(LC_CTYPE, "");
  XSetLocaleModifiers("@im=");

  XSetIOErrorHandler(io_error_handler);
  XSetErrorHandler(xerror_handler);

  Display *d = XOpenDisplay(0);
  if (!d) Fl::fatal("Can't open display: %s",XDisplayName(0));

  fl_open_display(d);
}